

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

string * __thiscall
pbrt::IdealDiffuseBxDF::ToString_abi_cxx11_(string *__return_storage_ptr__,IdealDiffuseBxDF *this)

{
  SampledSpectrum *in_RCX;
  
  StringPrintf<pbrt::SampledSpectrum_const&>
            (__return_storage_ptr__,(pbrt *)"[ IdealDiffuseBxDF R: %s ]",(char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string IdealDiffuseBxDF::ToString() const {
    return StringPrintf("[ IdealDiffuseBxDF R: %s ]", R);
}